

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallFinalizableHeapBlock.cpp
# Opt level: O1

void __thiscall
Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>::SetAttributes
          (SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *this,void *address,
          uchar attributes)

{
  size_t *psVar1;
  HeapInfo *pHVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  
  if (-1 < (char)attributes) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallFinalizableHeapBlock.cpp"
                       ,0x86,"((attributes & FinalizeBit) != 0)","(attributes & FinalizeBit) != 0");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar5 = 0;
  }
  SmallHeapBlockT<MediumAllocationBlockAttributes>::SetAttributes
            ((SmallHeapBlockT<MediumAllocationBlockAttributes> *)this,address,attributes);
  this->finalizeCount = this->finalizeCount + 1;
  pHVar2 = ((this->super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>).
            super_SmallHeapBlockT<MediumAllocationBlockAttributes>.heapBucket)->heapInfo;
  psVar1 = &pHVar2->liveFinalizableObjectCount;
  *psVar1 = *psVar1 + 1;
  psVar1 = &pHVar2->newFinalizableObjectCount;
  *psVar1 = *psVar1 + 1;
  return;
}

Assistant:

void
SmallFinalizableHeapBlockT<TBlockAttributes>::SetAttributes(void * address, unsigned char attributes)
{
    Assert((attributes & FinalizeBit) != 0);
    __super::SetAttributes(address, attributes);
    finalizeCount++;

#if ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP
    if (CONFIG_FLAG_RELEASE(EnableConcurrentSweepAlloc))
    {
        AssertMsg(!this->isPendingConcurrentSweepPrep, "Finalizable blocks don't support allocations during concurrent sweep.");
    }
#endif

#ifdef RECYCLER_FINALIZE_CHECK
    HeapInfo * heapInfo = this->heapBucket->heapInfo;
    heapInfo->liveFinalizableObjectCount++;
    heapInfo->newFinalizableObjectCount++;
#endif
}